

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.hpp
# Opt level: O0

uint __thiscall
BTree<StringBTree,_StringKey>::searchByKey(BTree<StringBTree,_StringKey> *this,StringKey *key)

{
  byte bVar1;
  uint uVar2;
  StringKey *key_00;
  uint8_t *puVar3;
  uint64_t uVar4;
  SearchResult *in_RSI;
  BTree<StringBTree,_StringKey> *in_RDI;
  uint index;
  uint32_t nextOffset;
  uint i;
  SearchResult result;
  uchar *data;
  uint offset;
  uint count;
  StringBTree *self;
  size_t in_stack_ffffffffffffff68;
  code *data_00;
  uchar *in_stack_ffffffffffffff70;
  StringBTree *this_00;
  KeyType *in_stack_ffffffffffffff78;
  uint local_44;
  uint in_stack_ffffffffffffffc0;
  uint in_stack_ffffffffffffffc4;
  uint local_34;
  BTree<StringBTree,_StringKey> *data_01;
  BTree<StringBTree,_StringKey> *this_01;
  uint local_4;
  
  data_01 = in_RDI;
  this_01 = in_RDI;
  bVar1 = readAtWithByteSwap<unsigned_char,unsigned_char>
                    (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  local_44 = (uint)bVar1;
  uVar2 = readAtWithByteSwap<unsigned_int,unsigned_char>
                    (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  key_00 = (StringKey *)
           advancePointer<unsigned_char>
                     (((BTree<StringBTree,_StringKey> *)&in_RDI->m_data)->m_data,
                      (ulong)(uVar2 & 0xffffff));
  SearchResult::SearchResult((SearchResult *)&stack0xffffffffffffffc0);
  uVar2 = local_44;
  do {
    if (local_44 == 0) {
      this_00 = (StringBTree *)0x0;
      puVar3 = searchWithComparison
                         (this_01,in_RSI,(uint8_t *)data_01,uVar2,key_00,
                          CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
LAB_00135754:
      if (uVar2 == 0) {
        in_stack_ffffffffffffffc4 = 0;
      }
      if (puVar3 == (uint8_t *)0x0) {
        local_4 = 0xffffffff;
      }
      else {
        local_4 = (local_34 - in_stack_ffffffffffffffc4) + in_stack_ffffffffffffffc0;
        StringBTree::parseData((StringBTree *)in_RDI,in_stack_ffffffffffffff78,(uint8_t *)this_00);
      }
      return local_4;
    }
    data_00 = StringBTree::lessThanKeyCompareOp;
    this_00 = (StringBTree *)0x0;
    puVar3 = searchWithComparison
                       (this_01,in_RSI,(uint8_t *)data_01,uVar2,key_00,
                        CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    if (puVar3 == (uint8_t *)0x0) {
      puVar3 = (uint8_t *)0x0;
      goto LAB_00135754;
    }
    uVar4 = decodeBitsAndAdvance((uint8_t **)&stack0xffffffffffffffd0);
    local_34 = (uint)uVar4;
    StringBTree::advanceData(this_00,(uint8_t *)data_00);
    uVar4 = decodeBitsAndAdvance((uint8_t **)&stack0xffffffffffffffd0);
    key_00 = (StringKey *)
             advancePointer<unsigned_char>
                       (((BTree<StringBTree,_StringKey> *)&in_RDI->m_data)->m_data,
                        uVar4 & 0xffffffff);
    local_44 = local_44 - 1;
  } while( true );
}

Assistant:

unsigned int searchByKey(Key& key) const
	{
		const auto& self = static_cast<const Derived&>(*this);
		
		const auto count = static_cast<unsigned int>(readAtWithByteSwap<uint8_t>(m_data, 0));
		const auto offset = readAtWithByteSwap<uint32_t>(m_data, 0) & UINT32_C(0xFFFFFF);
		
		auto data = advancePointer(m_data, offset);
		SearchResult result;
		for (auto i = count; i != 0; i--) {
			data = searchWithComparison(result, data, count, key, &Derived::lessThanKeyCompareOp);
			if (!data)
				goto done;
			
			result.maxIndex = static_cast<uint32_t>(decodeBitsAndAdvance(data));
			
			data = self.advanceData(data);
			
			const auto nextOffset = static_cast<uint32_t>(decodeBitsAndAdvance(data));
			data = advancePointer(m_data, nextOffset);
		}
		
		data = searchWithComparison(result, data, 0, key, &Derived::equalKeyCompareOp);

	done:
		if (count == 0)
			result.upperBound = 0;
			
		if (data) {
			const auto index = (result.maxIndex - result.upperBound + result.lowerBound);
			self.parseData(key, data);
			return index;
		} else {
			return INVALID_INDEX;
		}
	}